

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

void google::protobuf::internal::TcParser::WriteMapEntryAsUnknown
               (MessageLite *msg,TcParseTableBase *table,uint32_t tag,NodeBase *node,
               MapAuxInfo map_info)

{
  _func_void_MessageLite_ptr_int_string_view *p_Var1;
  string_view sVar2;
  LogMessage *pLVar3;
  int32_t *piVar4;
  UnknownFieldOps *pUVar5;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  LogMessageFatal local_d8 [22];
  Voidify local_c2;
  uint8_t local_c1;
  undefined1 local_c0 [8];
  CodedOutputStream coded_output;
  undefined1 local_60 [8];
  StringOutputStream string_output;
  string serialized;
  NodeBase *node_local;
  uint32_t tag_local;
  TcParseTableBase *table_local;
  MessageLite *msg_local;
  MapAuxInfo map_info_local;
  
  std::__cxx11::string::string((string *)&string_output.target_);
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)local_60,(string *)&string_output.target_);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            ((CodedOutputStream *)local_c0,(StringOutputStream *)local_60);
  msg_local._0_1_ = map_info.key_type_card.data_;
  local_c1 = msg_local._0_1_;
  SerializeMapKey(node,msg_local._0_1_,(CodedOutputStream *)local_c0);
  msg_local._2_1_ = map_info._2_1_;
  if ((msg_local._2_1_ >> 4 & 1) != 0) {
    msg_local._4_4_ = map_info.node_size_info;
    piVar4 = (int32_t *)NodeBase::GetVoidValue(node,msg_local._4_4_);
    WireFormatLite::WriteInt32(2,*piVar4,(CodedOutputStream *)local_c0);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_c0);
    io::StringOutputStream::~StringOutputStream((StringOutputStream *)local_60);
    pUVar5 = GetUnknownFieldOps(table);
    p_Var1 = pUVar5->write_length_delimited;
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&string_output.target_);
    (*p_Var1)(msg,tag >> 3,sVar2);
    std::__cxx11::string::~string((string *)&string_output.target_);
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"map_info.value_is_validated_enum");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0x9ca,local_e8._M_len,local_e8._M_str);
  pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_d8);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_c2,pLVar3);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_d8);
}

Assistant:

void TcParser::WriteMapEntryAsUnknown(MessageLite* msg,
                                      const TcParseTableBase* table,
                                      uint32_t tag, NodeBase* node,
                                      MapAuxInfo map_info) {
  std::string serialized;
  {
    io::StringOutputStream string_output(&serialized);
    io::CodedOutputStream coded_output(&string_output);
    SerializeMapKey(node, map_info.key_type_card, coded_output);
    // The mapped_type is always an enum here.
    ABSL_DCHECK(map_info.value_is_validated_enum);
    WireFormatLite::WriteInt32(2,
                               *reinterpret_cast<int32_t*>(
                                   node->GetVoidValue(map_info.node_size_info)),
                               &coded_output);
  }
  GetUnknownFieldOps(table).write_length_delimited(msg, tag >> 3, serialized);
}